

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_add(TCGContext_conflict1 *tcg_ctx,int size,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGv_i32 t1_local;
  TCGv_i32 t0_local;
  int size_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 0) {
    gen_helper_neon_add_u8(tcg_ctx,t0,t0,t1);
  }
  else if (size == 1) {
    gen_helper_neon_add_u16(tcg_ctx,t0,t0,t1);
  }
  else {
    if (size != 2) {
      abort();
    }
    tcg_gen_add_i32(tcg_ctx,t0,t0,t1);
  }
  return;
}

Assistant:

static inline void gen_neon_add(TCGContext *tcg_ctx, int size, TCGv_i32 t0, TCGv_i32 t1)
{
    switch (size) {
    case 0: gen_helper_neon_add_u8(tcg_ctx, t0, t0, t1); break;
    case 1: gen_helper_neon_add_u16(tcg_ctx, t0, t0, t1); break;
    case 2: tcg_gen_add_i32(tcg_ctx, t0, t0, t1); break;
    default: abort();
    }
}